

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5PorterStep1B(char *aBuf,int *pnBuf)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int *in_RSI;
  long in_RDI;
  int nBuf;
  int ret;
  undefined4 in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  uint local_14;
  
  local_14 = 0;
  iVar1 = *in_RSI;
  iVar2 = (int)*(char *)(in_RDI + (iVar1 + -2));
  if (iVar2 == 0x65) {
    if ((iVar1 < 4) || (iVar3 = memcmp("eed",(void *)(in_RDI + (iVar1 + -3)),3), iVar3 != 0)) {
      if ((2 < iVar1) && (iVar2 = memcmp("ed",(void *)(in_RDI + (iVar1 + -2)),2), iVar2 == 0)) {
        iVar2 = fts5Porter_Vowel((char *)CONCAT44(in_stack_ffffffffffffffdc,
                                                  in_stack_ffffffffffffffd8),0);
        if (iVar2 != 0) {
          *in_RSI = iVar1 + -2;
        }
        local_14 = (uint)(iVar2 != 0);
      }
    }
    else {
      iVar2 = fts5Porter_MGt0((char *)CONCAT44(iVar2,in_stack_ffffffffffffffe0),
                              in_stack_ffffffffffffffdc);
      if (iVar2 != 0) {
        *(undefined2 *)(in_RDI + (iVar1 + -3)) = 0x6565;
        *in_RSI = iVar1 + -1;
      }
    }
  }
  else if (((iVar2 == 0x6e) && (3 < iVar1)) &&
          (iVar2 = memcmp("ing",(void *)(in_RDI + (iVar1 + -3)),3), iVar2 == 0)) {
    iVar2 = fts5Porter_Vowel((char *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),0
                            );
    if (iVar2 != 0) {
      *in_RSI = iVar1 + -3;
    }
    local_14 = (uint)(iVar2 != 0);
  }
  return local_14;
}

Assistant:

static int fts5PorterStep1B(char *aBuf, int *pnBuf){
  int ret = 0;
  int nBuf = *pnBuf;
  switch( aBuf[nBuf-2] ){

    case 'e':
      if( nBuf>3 && 0==memcmp("eed", &aBuf[nBuf-3], 3) ){
        if( fts5Porter_MGt0(aBuf, nBuf-3) ){
          memcpy(&aBuf[nBuf-3], "ee", 2);
          *pnBuf = nBuf - 3 + 2;
        }
      }else if( nBuf>2 && 0==memcmp("ed", &aBuf[nBuf-2], 2) ){
        if( fts5Porter_Vowel(aBuf, nBuf-2) ){
          *pnBuf = nBuf - 2;
          ret = 1;
        }
      }
      break;

    case 'n':
      if( nBuf>3 && 0==memcmp("ing", &aBuf[nBuf-3], 3) ){
        if( fts5Porter_Vowel(aBuf, nBuf-3) ){
          *pnBuf = nBuf - 3;
          ret = 1;
        }
      }
      break;

  }
  return ret;
}